

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.c
# Opt level: O3

symbol * evaluate_offsetof(dmr_C *C,expression *expr)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  expression *expr_00;
  symbol *psVar5;
  position pVar6;
  ident *piVar7;
  symbol *psVar8;
  anon_union_8_2_e1606681_for_symbol_12 aVar9;
  undefined4 uVar10;
  expression_list *sym;
  symbol *psVar11;
  symbol *psVar12;
  expression *peVar13;
  string *psVar14;
  symbol *psVar15;
  int *in_RCX;
  char *pcVar16;
  long lVar17;
  undefined1 local_34 [8];
  int offset;
  
  expr_00 = (expr->field_5).field_6.right;
  sym = (expr->field_5).expr_list;
  if (expr->op == 0x2e) {
    local_34._0_4_ = 0;
    if (sym != (expression_list *)0x0) {
      dmrC_examine_symbol_type(C->S,(symbol *)sym);
      bVar1 = *(byte *)sym;
      if (bVar1 == 3) {
        sym = (expression_list *)sym->list_[0xc];
        bVar1 = *(byte *)sym;
      }
      if (bVar1 == 0xb) {
        sym = (expression_list *)dmrC_evaluate_expression(C,sym->list_[0x12]);
        if (sym == (expression_list *)0x0) {
          sym = (expression_list *)&C->S->bad_ctype;
        }
        else if (*(char *)sym == '\x03') {
          sym = (expression_list *)sym->list_[0xc];
        }
      }
      bVar1 = *(byte *)sym;
      if (bVar1 == 9) {
        sym = (expression_list *)sym->list_[0xc];
        bVar1 = *(byte *)sym;
      }
      if (bVar1 - 7 < 2) {
        psVar11 = find_identifier((dmr_C *)(expr->field_5).field_10.cond_false,
                                  (ident *)sym->list_[0xf],(symbol_list *)local_34,in_RCX);
        if (psVar11 == (symbol *)0x0) {
          pcVar16 = "unknown member";
          goto LAB_0010e29b;
        }
        *(undefined2 *)expr = 0x101;
        *(long *)&expr->field_5 = (long)(int)local_34._0_4_;
LAB_0010e350:
        (expr->field_5).field_0.taint = 0;
        expr->ctype = C->target->size_t_ctype;
        goto LAB_0010e4a0;
      }
    }
    pcVar16 = "expected structure or union";
LAB_0010e29b:
    dmrC_expression_error(C,expr,pcVar16);
    return (symbol *)0x0;
  }
  if (sym == (expression_list *)0x0) {
    pcVar16 = "expected structure or union";
    goto LAB_0010e3b8;
  }
  dmrC_examine_symbol_type(C->S,(symbol *)sym);
  cVar2 = *(char *)sym;
  if (cVar2 == '\x03') {
    sym = (expression_list *)sym->list_[0xc];
    cVar2 = *(char *)sym;
  }
  if (cVar2 == '\v') {
    sym = (expression_list *)dmrC_evaluate_expression(C,sym->list_[0x12]);
    if (sym == (expression_list *)0x0) {
      sym = (expression_list *)&C->S->bad_ctype;
    }
    else if (*(char *)sym == '\x03') {
      sym = (expression_list *)sym->list_[0xc];
    }
  }
  cVar2 = *(char *)sym;
  if (cVar2 == '\t') {
    sym = (expression_list *)sym->list_[0xc];
    cVar2 = *(char *)sym;
  }
  if (cVar2 != '\x06') {
    pcVar16 = "expected array";
    goto LAB_0010e3b8;
  }
  psVar11 = (symbol *)sym->list_[0xc];
  peVar13 = (expr->field_5).field_10.cond_false;
  if (peVar13 == (expression *)0x0) {
    *(undefined2 *)expr = 0x101;
    (expr->field_5).field_0.value = 0;
    goto LAB_0010e350;
  }
  psVar12 = dmrC_evaluate_expression(C,peVar13);
  bVar1 = *(byte *)psVar12;
  if (bVar1 == 3) {
    psVar12 = *(symbol **)((long)&psVar12->field_14 + 0x38);
    bVar1 = *(byte *)psVar12;
  }
  if (bVar1 == 0xb) {
    psVar12 = dmrC_evaluate_expression(C,(psVar12->field_14).field_2.initializer);
    if (psVar12 == (symbol *)0x0) {
      psVar12 = &C->S->bad_ctype;
    }
    else if (*(char *)psVar12 == '\x03') {
      psVar12 = *(symbol **)((long)&psVar12->field_14 + 0x38);
    }
  }
  bVar1 = *(byte *)psVar12;
  if (bVar1 == 9) {
    psVar12 = *(symbol **)((long)&psVar12->field_14 + 0x38);
    bVar1 = *(byte *)psVar12;
  }
  if (bVar1 == 2) {
    psVar5 = (psVar12->field_14).field_2.ctype.base_type;
    if (psVar5 == &C->S->int_type) goto LAB_0010e404;
    if (psVar5 != &C->S->fp_type) goto LAB_0010e3a6;
  }
  else {
LAB_0010e3a6:
    if ((0x1a000UL >> ((ulong)bVar1 & 0x3f) & 1) != 0) {
      if (0xfffffffd < bVar1 - 0x11) {
        if (bVar1 == 0x10) {
          psVar12 = (psVar12->field_14).field_2.ctype.base_type;
        }
        pcVar16 = dmrC_show_typename(C,psVar12);
        dmrC_warning(C,peVar13->pos,"%s degrades to integer",pcVar16);
      }
LAB_0010e404:
      peVar13 = cast_to(C,peVar13,C->target->size_t_ctype);
      iVar3 = (psVar11->field_14).field_1.normal;
      if (iVar3 < 0) {
        lVar17 = -1;
      }
      else {
        iVar4 = C->target->bits_in_char;
        lVar17 = (long)((iVar3 + iVar4 + -1) / iVar4);
      }
      pVar6 = expr->pos;
      psVar14 = (string *)dmrC_allocator_allocate(&C->expression_allocator,0);
      *(undefined1 *)psVar14 = 1;
      *(position *)(psVar14 + 2) = pVar6;
      *(long *)(psVar14 + 8) = lVar17;
      *(symbol **)(psVar14 + 4) = C->target->size_t_ctype;
      *(ushort *)psVar14 = 0x101;
      *(undefined1 *)expr = 5;
      (expr->field_5).field_3.unop = peVar13;
      (expr->field_5).field_2.string = psVar14;
      expr->op = 0x2a;
      expr->ctype = C->target->size_t_ctype;
      *(ushort *)expr = *(ushort *)psVar14 & *(ushort *)peVar13 & 0x100 | 5;
LAB_0010e4a0:
      if (expr_00 != (expression *)0x0) {
        psVar15 = (symbol *)dmrC_allocator_allocate(&C->expression_allocator,0);
        uVar10 = *(undefined4 *)&expr->field_0x0;
        iVar3 = expr->op;
        pVar6 = expr->pos;
        psVar12 = expr->ctype;
        piVar7 = *(ident **)&expr->field_0x18;
        psVar5 = (symbol *)(expr->field_5).field_0.value;
        psVar8 = (symbol *)(expr->field_5).field_2.string;
        aVar9 = (anon_union_8_2_e1606681_for_symbol_12)(expr->field_5).field_14.ident_expression;
        psVar15->scope = (scope *)(expr->field_5).field_10.cond_false;
        psVar15->field_12 = aVar9;
        psVar15->next_id = psVar5;
        psVar15->replace = psVar8;
        *(symbol **)&(psVar15->endpos).field_0x4 = psVar12;
        psVar15->ident = piVar7;
        *(undefined4 *)&psVar15->field_0x0 = uVar10;
        *(int *)&(psVar15->pos).field_0x0 = iVar3;
        *(position *)&(psVar15->pos).field_0x4 = pVar6;
        if (*(char *)expr_00 == '\x1e') {
          (expr_00->field_5).field_4.symbol = psVar11;
        }
        psVar11 = dmrC_evaluate_expression(C,expr_00);
        if (psVar11 == (symbol *)0x0) {
          return (symbol *)0x0;
        }
        *(undefined1 *)expr = 5;
        *(ushort *)expr = *(ushort *)expr_00 & *(ushort *)psVar15 & 0x100 | 5;
        expr->op = 0x2b;
        expr->ctype = C->target->size_t_ctype;
        (expr->field_5).field_4.symbol = psVar15;
        (expr->field_5).field_6.right = expr_00;
      }
      return C->target->size_t_ctype;
    }
  }
  pcVar16 = "non-integer index";
LAB_0010e3b8:
  dmrC_expression_error(C,expr,pcVar16);
  return (symbol *)0x0;
}

Assistant:

static struct symbol *evaluate_offsetof(struct dmr_C *C, struct expression *expr)
{
	struct expression *e = expr->down;
	struct symbol *ctype = expr->in;
	int klass;

	if (expr->op == '.') {
		struct symbol *field;
		int offset = 0;
		if (!ctype) {
			dmrC_expression_error(C, expr, "expected structure or union");
			return NULL;
		}
		dmrC_examine_symbol_type(C->S, ctype);
		klass = classify_type(C, ctype, &ctype);
		if (klass != TYPE_COMPOUND) {
			dmrC_expression_error(C, expr, "expected structure or union");
			return NULL;
		}

		field = find_identifier(C, expr->ident, ctype->symbol_list, &offset);
		if (!field) {
			dmrC_expression_error(C, expr, "unknown member");
			return NULL;
		}
		ctype = field;
		expr->type = EXPR_VALUE;
		expr->flags = Int_const_expr;
		expr->value = offset;
		expr->taint = 0;
		expr->ctype = C->target->size_t_ctype;
	} else {
		if (!ctype) {
			dmrC_expression_error(C, expr, "expected structure or union");
			return NULL;
		}
		dmrC_examine_symbol_type(C->S, ctype);
		klass = classify_type(C, ctype, &ctype);
		if (klass != (TYPE_COMPOUND | TYPE_PTR)) {
			dmrC_expression_error(C, expr, "expected array");
			return NULL;
		}
		ctype = ctype->ctype.base_type;
		if (!expr->index) {
			expr->type = EXPR_VALUE;
			expr->flags = Int_const_expr;
			expr->value = 0;
			expr->taint = 0;
			expr->ctype = C->target->size_t_ctype;
		} else {
			struct expression *idx = expr->index, *m;
			struct symbol *i_type = dmrC_evaluate_expression(C, idx);
			int i_class = classify_type(C, i_type, &i_type);
			if (!is_int(i_class)) {
				dmrC_expression_error(C, expr, "non-integer index");
				return NULL;
			}
			unrestrict(C, idx, i_class, &i_type);
			idx = cast_to(C, idx, C->target->size_t_ctype);
			m = dmrC_alloc_const_expression(C, expr->pos,
						   dmrC_bits_to_bytes(C->target, ctype->bit_size));
			m->ctype = C->target->size_t_ctype;
			m->flags = Int_const_expr;
			expr->type = EXPR_BINOP;
			expr->left = idx;
			expr->right = m;
			expr->op = '*';
			expr->ctype = C->target->size_t_ctype;
			expr->flags = m->flags & idx->flags & Int_const_expr;
		}
	}
	if (e) {
		struct expression *copy = (struct expression *)dmrC_allocator_allocate(&C->expression_allocator, 0);
		*copy = *expr;
		if (e->type == EXPR_OFFSETOF)
			e->in = ctype;
		if (!dmrC_evaluate_expression(C, e))
			return NULL;
		expr->type = EXPR_BINOP;
		expr->flags = e->flags & copy->flags & Int_const_expr;
		expr->op = '+';
		expr->ctype = C->target->size_t_ctype;
		expr->left = copy;
		expr->right = e;
	}
	return C->target->size_t_ctype;
}